

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int createFunctionApi(sqlite3 *db,char *zFunc,int nArg,int enc,void *p,
                     _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xSFunc,
                     _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xStep,
                     _func_void_sqlite3_context_ptr *xFinal,_func_void_sqlite3_context_ptr *xValue,
                     _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xInverse,
                     _func_void_void_ptr *xDestroy)

{
  int rc;
  int iVar1;
  FuncDestructor *pDestructor;
  
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  if (xDestroy == (_func_void_void_ptr *)0x0) {
    pDestructor = (FuncDestructor *)0x0;
  }
  else {
    pDestructor = (FuncDestructor *)sqlite3Malloc(0x18);
    if (pDestructor == (FuncDestructor *)0x0) {
      sqlite3OomFault(db);
      (*xDestroy)(p);
      rc = 1;
      goto LAB_0012d096;
    }
    pDestructor->nRef = 0;
    pDestructor->xDestroy = xDestroy;
    pDestructor->pUserData = p;
  }
  rc = sqlite3CreateFunc(db,zFunc,nArg,enc,p,xSFunc,xStep,xFinal,xValue,xInverse,pDestructor);
  if ((pDestructor != (FuncDestructor *)0x0) && (pDestructor->nRef == 0)) {
    (*xDestroy)(p);
    sqlite3_free(pDestructor);
  }
LAB_0012d096:
  if ((rc != 0) || (iVar1 = 0, db->mallocFailed != '\0')) {
    iVar1 = apiHandleError(db,rc);
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar1;
}

Assistant:

static int createFunctionApi(
  sqlite3 *db,
  const char *zFunc,
  int nArg,
  int enc,
  void *p,
  void (*xSFunc)(sqlite3_context*,int,sqlite3_value**),
  void (*xStep)(sqlite3_context*,int,sqlite3_value**),
  void (*xFinal)(sqlite3_context*),
  void (*xValue)(sqlite3_context*),
  void (*xInverse)(sqlite3_context*,int,sqlite3_value**),
  void(*xDestroy)(void*)
){
  int rc = SQLITE_ERROR;
  FuncDestructor *pArg = 0;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  sqlite3_mutex_enter(db->mutex);
  if( xDestroy ){
    pArg = (FuncDestructor *)sqlite3Malloc(sizeof(FuncDestructor));
    if( !pArg ){
      sqlite3OomFault(db);
      xDestroy(p);
      goto out;
    }
    pArg->nRef = 0;
    pArg->xDestroy = xDestroy;
    pArg->pUserData = p;
  }
  rc = sqlite3CreateFunc(db, zFunc, nArg, enc, p,
      xSFunc, xStep, xFinal, xValue, xInverse, pArg
  );
  if( pArg && pArg->nRef==0 ){
    assert( rc!=SQLITE_OK || (xStep==0 && xFinal==0) );
    xDestroy(p);
    sqlite3_free(pArg);
  }

 out:
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}